

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaAllocateMemoryForImage
                   (VmaAllocator allocator,VkImage image,VmaAllocationCreateInfo *pCreateInfo,
                   VmaAllocation *pAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VkResult VVar1;
  bool *in_RCX;
  VmaAllocator_T *in_RDX;
  VkMemoryRequirements *in_RSI;
  VkImage in_RDI;
  long in_R8;
  VmaAllocator_T *unaff_retaddr;
  VkResult result;
  bool prefersDedicatedAllocation;
  bool requiresDedicatedAllocation;
  VkMemoryRequirements vkMemReq;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  VkMemoryRequirements *in_stack_00000080;
  VmaAllocator_T *in_stack_00000088;
  VkFlags in_stack_000000d0;
  VmaAllocationCreateInfo *in_stack_000000d8;
  VmaSuballocationType in_stack_000000e0;
  size_t in_stack_000000e8;
  VmaAllocation *in_stack_000000f0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_40 [24];
  long local_28;
  
  local_28 = in_R8;
  memset(local_40,0,0x18);
  VmaAllocator_T::GetImageMemoryRequirements(unaff_retaddr,in_RDI,in_RSI,&in_RDX->m_UseMutex,in_RCX)
  ;
  uVar2 = 0xffffffff;
  VVar1 = VmaAllocator_T::AllocateMemory
                    (in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e,
                     (VkBuffer)allocator,image,in_stack_000000d0,in_stack_000000d8,in_stack_000000e0
                     ,in_stack_000000e8,in_stack_000000f0);
  if ((local_28 != 0) && (VVar1 == VK_SUCCESS)) {
    VmaAllocator_T::GetAllocationInfo
              (in_RDX,(VmaAllocation)CONCAT44(in_stack_ffffffffffffff8c,uVar2),
               (VmaAllocationInfo *)0x302b87);
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaAllocateMemoryForImage(
    VmaAllocator allocator,
    VkImage image,
    const VmaAllocationCreateInfo* pCreateInfo,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && image != VK_NULL_HANDLE && pCreateInfo && pAllocation);

    VMA_DEBUG_LOG("vmaAllocateMemoryForImage");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    VkMemoryRequirements vkMemReq = {};
    bool requiresDedicatedAllocation = false;
    bool prefersDedicatedAllocation  = false;
    allocator->GetImageMemoryRequirements(image, vkMemReq,
        requiresDedicatedAllocation, prefersDedicatedAllocation);

    VkResult result = allocator->AllocateMemory(
        vkMemReq,
        requiresDedicatedAllocation,
        prefersDedicatedAllocation,
        VK_NULL_HANDLE, // dedicatedBuffer
        image, // dedicatedImage
        UINT32_MAX, // dedicatedBufferImageUsage
        *pCreateInfo,
        VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN,
        1, // allocationCount
        pAllocation);

    if(pAllocationInfo && result == VK_SUCCESS)
    {
        allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
    }

    return result;
}